

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzDD::NodeIntStateScatter
          (ChNodeFEAxyzDD *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T)

{
  ChStateDelta *vector;
  ChVector<double> local_108;
  ChStateDelta *local_f0;
  ChVector<double> local_e8;
  ChVector<double> local_c8;
  ChVector<double> local_a8;
  ChVector<double> local_88;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_68 [56];
  
  local_f0 = v;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &x->super_ChVectorDynamic<double>,(ulong)off_x,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_108,local_68,(type *)0x0);
  if ((ChVector<double> *)
      &(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x20 != &local_108)
  {
    *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x20 =
         local_108.m_data[0];
    *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x28 = local_108.m_data[1];
    *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x30 = local_108.m_data[2];
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &x->super_ChVectorDynamic<double>,(ulong)(off_x + 3),3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_88,local_68,(type *)0x0);
  if ((ChVector<double> *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0xf0 != &local_88) {
    *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0xf0 = local_88.m_data[0];
    *(double *)&(this->super_ChNodeFEAxyzD).field_0xf8 = local_88.m_data[1];
    *(double *)&(this->super_ChNodeFEAxyzD).field_0x100 = local_88.m_data[2];
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &x->super_ChVectorDynamic<double>,(ulong)(off_x + 6),3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_a8,local_68,(type *)0x0);
  vector = local_f0;
  if ((ChVector<double> *)&(this->super_ChNodeFEAxyzD).field_0x140 != &local_a8) {
    *(double *)&(this->super_ChNodeFEAxyzD).field_0x140 = local_a8.m_data[0];
    *(double *)&this->field_0x148 = local_a8.m_data[1];
    *(double *)&this->field_0x150 = local_a8.m_data[2];
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &local_f0->super_ChVectorDynamic<double>,(ulong)off_v,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_108,local_68,(type *)0x0);
  if ((ChVector<double> *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x38 != &local_108)
  {
    *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x38 = local_108.m_data[0];
    *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x40 = local_108.m_data[1];
    *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x48 = local_108.m_data[2];
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &vector->super_ChVectorDynamic<double>,(ulong)(off_v + 3),3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_c8,local_68,(type *)0x0);
  if (&(this->super_ChNodeFEAxyzD).D_dt != &local_c8) {
    (this->super_ChNodeFEAxyzD).D_dt.m_data[0] = local_c8.m_data[0];
    (this->super_ChNodeFEAxyzD).D_dt.m_data[1] = local_c8.m_data[1];
    (this->super_ChNodeFEAxyzD).D_dt.m_data[2] = local_c8.m_data[2];
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
             &vector->super_ChVectorDynamic<double>,(ulong)(off_v + 6),3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_e8,local_68,(type *)0x0);
  if (&this->DD_dt != &local_e8) {
    (this->DD_dt).m_data[0] = local_e8.m_data[0];
    (this->DD_dt).m_data[1] = local_e8.m_data[1];
    (this->DD_dt).m_data[2] = local_e8.m_data[2];
  }
  return;
}

Assistant:

void ChNodeFEAxyzDD::NodeIntStateScatter(const unsigned int off_x,
                                         const ChState& x,
                                         const unsigned int off_v,
                                         const ChStateDelta& v,
                                         const double T) {
    SetPos(x.segment(off_x, 3));
    SetD(x.segment(off_x + 3, 3));
    SetDD(x.segment(off_x + 6, 3));

    SetPos_dt(v.segment(off_v, 3));
    SetD_dt(v.segment(off_v + 3, 3));
    SetDD_dt(v.segment(off_v + 6, 3));
}